

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_error_offset(sqlite3 *db)

{
  int iVar1;
  int local_14;
  int iOffset;
  sqlite3 *db_local;
  
  local_14 = -1;
  if (db != (sqlite3 *)0x0) {
    iVar1 = sqlite3SafetyCheckSickOrOk(db);
    if ((iVar1 != 0) && (db->errCode != 0)) {
      sqlite3_mutex_enter(db->mutex);
      local_14 = db->errByteOffset;
      sqlite3_mutex_leave(db->mutex);
    }
  }
  return local_14;
}

Assistant:

SQLITE_API int sqlite3_error_offset(sqlite3 *db){
  int iOffset = -1;
  if( db && sqlite3SafetyCheckSickOrOk(db) && db->errCode ){
    sqlite3_mutex_enter(db->mutex);
    iOffset = db->errByteOffset;
    sqlite3_mutex_leave(db->mutex);
  }
  return iOffset;
}